

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pm_matrix_tests.h
# Opt level: O3

void test_chain_constructors<Gudhi::persistence_matrix::Matrix<Chain_vine_options_with_row_access<(Gudhi::persistence_matrix::Column_types)7,true,false,false,false,true,false,false>>>
               (void)

{
  uint uVar1;
  _Hash_node_base *p_Var2;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined8 uVar13;
  ulong uVar14;
  int local_94c;
  undefined8 local_948;
  undefined4 *local_940;
  undefined4 ****local_938;
  char *local_930;
  shared_count sStack_928;
  undefined8 *local_920;
  undefined **local_918;
  char *local_910;
  undefined8 *local_908;
  undefined4 **local_900;
  undefined4 local_8f4;
  undefined8 local_8f0;
  char *local_8e8;
  shared_count sStack_8e0;
  undefined4 ***local_8d8;
  ulong local_8d0;
  shared_count sStack_8c8;
  char *local_8c0;
  undefined4 **local_8b8;
  char *local_8b0;
  Matrix<Chain_vine_options_with_row_access<(Gudhi::persistence_matrix::Column_types)7,_true,_false,_false,_false,_true,_false,_false>_>
  mb;
  undefined1 local_7a8 [24];
  undefined4 ***local_790;
  _Invoker_type local_788;
  _Any_data local_780;
  _Manager_type local_770;
  _Invoker_type local_768;
  pointer local_760;
  pointer pvStack_758;
  pointer local_750;
  pointer local_748;
  pointer puStack_740;
  undefined4 local_738;
  undefined4 uStack_734;
  undefined4 uStack_730;
  undefined4 uStack_72c;
  _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Chain_vine_options_with_row_access<(Gudhi::persistence_matrix::Column_types)7,_true,_false,_false,_false,_true,_false,_false>_>_>_>,_std::allocator<std::pair<const_unsigned_int,_Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Chain_vine_options_with_row_access<(Gudhi::persistence_matrix::Column_types)7,_true,_false,_false,_false,_true,_false,_false>_>_>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  local_728;
  _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  _Stack_6f0;
  Index local_6b8;
  Column_settings *local_6b0;
  Matrix<Chain_vine_options_with_row_access<(Gudhi::persistence_matrix::Column_types)7,_true,_false,_false,_false,_true,_false,_false>_>
  mc1;
  vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  ordered_boundaries;
  Matrix<Chain_vine_options_with_row_access<(Gudhi::persistence_matrix::Column_types)7,_true,_false,_false,_false,_true,_false,_false>_>
  mr;
  Matrix<Chain_vine_options_with_row_access<(Gudhi::persistence_matrix::Column_types)7,_true,_false,_false,_false,_true,_false,_false>_>
  mc2;
  char *local_380;
  char *local_378;
  undefined1 *local_370;
  undefined1 *local_368;
  char *local_360;
  char *local_358;
  undefined1 *local_350;
  undefined1 *local_348;
  char *local_340;
  char *local_338;
  undefined1 *local_330;
  undefined1 *local_328;
  char *local_320;
  char *local_318;
  undefined1 *local_310;
  undefined1 *local_308;
  char *local_300;
  char *local_2f8;
  undefined1 *local_2f0;
  undefined1 *local_2e8;
  char *local_2e0;
  char *local_2d8;
  undefined1 *local_2d0;
  undefined1 *local_2c8;
  char *local_2c0;
  char *local_2b8;
  undefined1 *local_2b0;
  undefined1 *local_2a8;
  char *local_2a0;
  char *local_298;
  undefined1 *local_290;
  undefined1 *local_288;
  char *local_280;
  char *local_278;
  undefined1 *local_270;
  undefined1 *local_268;
  char *local_260;
  char *local_258;
  undefined1 *local_250;
  undefined1 *local_248;
  char *local_240;
  char *local_238;
  undefined1 *local_230;
  undefined1 *local_228;
  char *local_220;
  char *local_218;
  undefined1 *local_210;
  undefined1 *local_208;
  char *local_200;
  char *local_1f8;
  undefined1 *local_1f0;
  undefined1 *local_1e8;
  char *local_1e0;
  char *local_1d8;
  undefined1 *local_1d0;
  undefined1 *local_1c8;
  char *local_1c0;
  char *local_1b8;
  undefined1 *local_1b0;
  undefined1 *local_1a8;
  char *local_1a0;
  char *local_198;
  undefined1 *local_190;
  undefined1 *local_188;
  char *local_180;
  char *local_178;
  undefined1 *local_170;
  undefined1 *local_168;
  char *local_160;
  char *local_158;
  undefined1 *local_150;
  undefined1 *local_148;
  char *local_140;
  char *local_138;
  Matrix<Chain_vine_options_with_row_access<(Gudhi::persistence_matrix::Column_types)7,_true,_false,_false,_false,_true,_false,_false>_>
  m;
  
  build_simple_boundary_matrix<Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Chain_vine_options_with_row_access<(Gudhi::persistence_matrix::Column_types)7,true,false,false,false,true,false,false>>>>
            ();
  mb.matrix_.super_Chain_vine_swap_option.birthComp_.super__Function_base._M_functor._M_unused.
  _M_object = (void *)0x0;
  mb.colSettings_ = (Column_settings *)birth_comp;
  mb.matrix_.super_Chain_vine_swap_option.birthComp_.super__Function_base._M_manager =
       std::
       _Function_handler<bool_(unsigned_int,_unsigned_int),_bool_(*)(unsigned_int,_unsigned_int)>::
       _M_invoke;
  mb.matrix_.super_Chain_vine_swap_option.birthComp_.super__Function_base._M_functor._8_8_ =
       std::
       _Function_handler<bool_(unsigned_int,_unsigned_int),_bool_(*)(unsigned_int,_unsigned_int)>::
       _M_manager;
  mr.matrix_.super_Chain_vine_swap_option.birthComp_.super__Function_base._M_functor._M_unused.
  _M_object = (void *)0x0;
  mr.colSettings_ = (Column_settings *)death_comp;
  mr.matrix_.super_Chain_vine_swap_option.birthComp_.super__Function_base._M_manager =
       std::
       _Function_handler<bool_(unsigned_int,_unsigned_int),_bool_(*)(unsigned_int,_unsigned_int)>::
       _M_invoke;
  mr.matrix_.super_Chain_vine_swap_option.birthComp_.super__Function_base._M_functor._8_8_ =
       std::
       _Function_handler<bool_(unsigned_int,_unsigned_int),_bool_(*)(unsigned_int,_unsigned_int)>::
       _M_manager;
  m.colSettings_ = (Column_settings *)operator_new(0x38);
  ((m.colSettings_)->entryConstructor).entryPool_.
  super_pool<boost::default_user_allocator_malloc_free>.
  super_simple_segregated_storage<unsigned_long>.first = (void *)0x0;
  ((m.colSettings_)->entryConstructor).entryPool_.
  super_pool<boost::default_user_allocator_malloc_free>.list.ptr = (char *)0x0;
  ((m.colSettings_)->entryConstructor).entryPool_.
  super_pool<boost::default_user_allocator_malloc_free>.list.sz = 0;
  ((m.colSettings_)->entryConstructor).entryPool_.
  super_pool<boost::default_user_allocator_malloc_free>.requested_size = 0x20;
  ((m.colSettings_)->entryConstructor).entryPool_.
  super_pool<boost::default_user_allocator_malloc_free>.next_size = 0x20;
  ((m.colSettings_)->entryConstructor).entryPool_.
  super_pool<boost::default_user_allocator_malloc_free>.start_size = 0x20;
  ((m.colSettings_)->entryConstructor).entryPool_.
  super_pool<boost::default_user_allocator_malloc_free>.max_size = 0;
  Gudhi::persistence_matrix::
  Chain_matrix<Gudhi::persistence_matrix::Matrix<Chain_vine_options_with_row_access<(Gudhi::persistence_matrix::Column_types)7,true,false,false,false,true,false,false>>>
  ::
  Chain_matrix<std::function<bool(unsigned_int,unsigned_int)>,std::function<bool(unsigned_int,unsigned_int)>>
            ((Chain_matrix<Gudhi::persistence_matrix::Matrix<Chain_vine_options_with_row_access<(Gudhi::persistence_matrix::Column_types)7,true,false,false,false,true,false,false>>>
              *)&m.matrix_,m.colSettings_,(function<bool_(unsigned_int,_unsigned_int)> *)&mb,
             (function<bool_(unsigned_int,_unsigned_int)> *)&mr);
  if (mr.matrix_.super_Chain_vine_swap_option.birthComp_.super__Function_base._M_functor._8_8_ != 0)
  {
    (*(code *)mr.matrix_.super_Chain_vine_swap_option.birthComp_.super__Function_base._M_functor.
              _8_8_)(&mr,&mr,3);
  }
  if (mb.matrix_.super_Chain_vine_swap_option.birthComp_.super__Function_base._M_functor._8_8_ != 0)
  {
    (*(code *)mb.matrix_.super_Chain_vine_swap_option.birthComp_.super__Function_base._M_functor.
              _8_8_)(&mb,&mb,3);
  }
  local_140 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_138 = "";
  local_150 = &boost::unit_test::basic_cstring<char_const>::null;
  local_148 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_140,0x15f);
  mc1.matrix_.super_Chain_vine_swap_option.birthComp_.super__Function_base._M_functor._M_unused.
  _M_member_pointer =
       mc1.matrix_.super_Chain_vine_swap_option.birthComp_.super__Function_base._M_functor._M_unused
       ._M_member_pointer & 0xffffffffffffff00;
  mc1.colSettings_ = (Column_settings *)&PTR__lazy_ostream_00236060;
  mc1.matrix_.super_Chain_vine_swap_option.birthComp_.super__Function_base._M_functor._8_8_ =
       &boost::unit_test::lazy_ostream::inst;
  mc1.matrix_.super_Chain_vine_swap_option.birthComp_.super__Function_base._M_manager =
       (_Manager_type)0x1f3264;
  local_938 = &local_8d8;
  local_8d8 = (undefined4 ***)CONCAT44(local_8d8._4_4_,(int)m.matrix_.matrix_._M_h._M_element_count)
  ;
  local_918 = (undefined **)&local_8f0;
  mc2.colSettings_ =
       (Column_settings *)
       CONCAT71(mc2.colSettings_._1_7_,(int)m.matrix_.matrix_._M_h._M_element_count == 0);
  local_8f0 = (char *)((ulong)local_8f0._4_4_ << 0x20);
  mc2.matrix_.super_Chain_vine_swap_option.birthComp_.super__Function_base._M_functor._M_unused.
  _M_object = (void *)0x0;
  mc2.matrix_.super_Chain_vine_swap_option.birthComp_.super__Function_base._M_functor._8_8_ = 0;
  local_7a8._0_8_ =
       "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_7a8._8_8_ = "";
  mb.matrix_.super_Chain_vine_swap_option.birthComp_.super__Function_base._M_manager =
       (_Manager_type)&local_938;
  mb.matrix_.super_Chain_vine_swap_option.birthComp_.super__Function_base._M_functor._M_unused.
  _M_member_pointer =
       mb.matrix_.super_Chain_vine_swap_option.birthComp_.super__Function_base._M_functor._M_unused.
       _M_member_pointer & 0xffffffffffffff00;
  mb.colSettings_ = (Column_settings *)&PTR__lazy_ostream_00235fd0;
  mb.matrix_.super_Chain_vine_swap_option.birthComp_.super__Function_base._M_functor._8_8_ =
       &boost::unit_test::lazy_ostream::inst;
  mr.matrix_.super_Chain_vine_swap_option.birthComp_.super__Function_base._M_functor._M_unused.
  _M_member_pointer =
       mr.matrix_.super_Chain_vine_swap_option.birthComp_.super__Function_base._M_functor._M_unused.
       _M_member_pointer & 0xffffffffffffff00;
  mr.colSettings_ = (Column_settings *)&PTR__lazy_ostream_00236020;
  mr.matrix_.super_Chain_vine_swap_option.birthComp_.super__Function_base._M_functor._8_8_ =
       &boost::unit_test::lazy_ostream::inst;
  mr.matrix_.super_Chain_vine_swap_option.birthComp_.super__Function_base._M_manager =
       (_Manager_type)&local_918;
  boost::test_tools::tt_detail::report_assertion();
  boost::detail::shared_count::~shared_count
            ((shared_count *)
             ((long)&mc2.matrix_.super_Chain_vine_swap_option.birthComp_.super__Function_base.
                     _M_functor + 8));
  mr.matrix_.super_Chain_vine_swap_option.birthComp_.super__Function_base._M_functor._M_unused.
  _M_object = (void *)0x0;
  mr.colSettings_ = (Column_settings *)birth_comp;
  mr.matrix_.super_Chain_vine_swap_option.birthComp_.super__Function_base._M_manager =
       std::
       _Function_handler<bool_(unsigned_int,_unsigned_int),_bool_(*)(unsigned_int,_unsigned_int)>::
       _M_invoke;
  mr.matrix_.super_Chain_vine_swap_option.birthComp_.super__Function_base._M_functor._8_8_ =
       std::
       _Function_handler<bool_(unsigned_int,_unsigned_int),_bool_(*)(unsigned_int,_unsigned_int)>::
       _M_manager;
  mc1.matrix_.super_Chain_vine_swap_option.birthComp_.super__Function_base._M_functor._M_unused.
  _M_object = (void *)0x0;
  mc1.colSettings_ = (Column_settings *)death_comp;
  mc1.matrix_.super_Chain_vine_swap_option.birthComp_.super__Function_base._M_manager =
       std::
       _Function_handler<bool_(unsigned_int,_unsigned_int),_bool_(*)(unsigned_int,_unsigned_int)>::
       _M_invoke;
  mc1.matrix_.super_Chain_vine_swap_option.birthComp_.super__Function_base._M_functor._8_8_ =
       std::
       _Function_handler<bool_(unsigned_int,_unsigned_int),_bool_(*)(unsigned_int,_unsigned_int)>::
       _M_manager;
  mb.colSettings_ = (Column_settings *)operator_new(0x38);
  ((mb.colSettings_)->entryConstructor).entryPool_.
  super_pool<boost::default_user_allocator_malloc_free>.
  super_simple_segregated_storage<unsigned_long>.first = (void *)0x0;
  ((mb.colSettings_)->entryConstructor).entryPool_.
  super_pool<boost::default_user_allocator_malloc_free>.list.ptr = (char *)0x0;
  ((mb.colSettings_)->entryConstructor).entryPool_.
  super_pool<boost::default_user_allocator_malloc_free>.list.sz = 0;
  ((mb.colSettings_)->entryConstructor).entryPool_.
  super_pool<boost::default_user_allocator_malloc_free>.requested_size = 0x20;
  ((mb.colSettings_)->entryConstructor).entryPool_.
  super_pool<boost::default_user_allocator_malloc_free>.next_size = 0x20;
  ((mb.colSettings_)->entryConstructor).entryPool_.
  super_pool<boost::default_user_allocator_malloc_free>.start_size = 0x20;
  ((mb.colSettings_)->entryConstructor).entryPool_.
  super_pool<boost::default_user_allocator_malloc_free>.max_size = 0;
  Gudhi::persistence_matrix::
  Chain_matrix<Gudhi::persistence_matrix::Matrix<Chain_vine_options_with_row_access<(Gudhi::persistence_matrix::Column_types)7,true,false,false,false,true,false,false>>>
  ::
  Chain_matrix<std::function<bool(unsigned_int,unsigned_int)>,std::function<bool(unsigned_int,unsigned_int)>,std::vector<unsigned_int,std::allocator<unsigned_int>>>
            ((Chain_matrix<Gudhi::persistence_matrix::Matrix<Chain_vine_options_with_row_access<(Gudhi::persistence_matrix::Column_types)7,true,false,false,false,true,false,false>>>
              *)&mb.matrix_,&ordered_boundaries,mb.colSettings_,
             (function<bool_(unsigned_int,_unsigned_int)> *)&mr,
             (function<bool_(unsigned_int,_unsigned_int)> *)&mc1);
  if (mc1.matrix_.super_Chain_vine_swap_option.birthComp_.super__Function_base._M_functor._8_8_ != 0
     ) {
    (*(code *)mc1.matrix_.super_Chain_vine_swap_option.birthComp_.super__Function_base._M_functor.
              _8_8_)(&mc1,&mc1,3);
  }
  if (mr.matrix_.super_Chain_vine_swap_option.birthComp_.super__Function_base._M_functor._8_8_ != 0)
  {
    (*(code *)mr.matrix_.super_Chain_vine_swap_option.birthComp_.super__Function_base._M_functor.
              _8_8_)(&mr,&mr,3);
  }
  local_160 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_158 = "";
  local_170 = &boost::unit_test::basic_cstring<char_const>::null;
  local_168 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_160,0x163);
  mc2.matrix_.super_Chain_vine_swap_option.birthComp_.super__Function_base._M_functor._M_unused.
  _M_member_pointer =
       mc2.matrix_.super_Chain_vine_swap_option.birthComp_.super__Function_base._M_functor._M_unused
       ._M_member_pointer & 0xffffffffffffff00;
  mc2.colSettings_ = (Column_settings *)&PTR__lazy_ostream_00236060;
  mc2.matrix_.super_Chain_vine_swap_option.birthComp_.super__Function_base._M_functor._8_8_ =
       &boost::unit_test::lazy_ostream::inst;
  mc2.matrix_.super_Chain_vine_swap_option.birthComp_.super__Function_base._M_manager =
       (_Manager_type)0x1f3264;
  local_8d8 = &local_8b8;
  local_8b8._0_4_ = 7;
  local_7a8._8_8_ = (void *)0x0;
  local_7a8._16_8_ = 0;
  local_938 = (undefined4 ****)0x1f32e6;
  local_930 = "";
  local_918 = (undefined **)&local_8f0;
  mr.matrix_.super_Chain_vine_swap_option.birthComp_.super__Function_base._M_functor._M_unused.
  _M_member_pointer =
       mr.matrix_.super_Chain_vine_swap_option.birthComp_.super__Function_base._M_functor._M_unused.
       _M_member_pointer & 0xffffffffffffff00;
  mr.colSettings_ = (Column_settings *)&PTR__lazy_ostream_00235fd0;
  mr.matrix_.super_Chain_vine_swap_option.birthComp_.super__Function_base._M_functor._8_8_ =
       &boost::unit_test::lazy_ostream::inst;
  mc1.matrix_.super_Chain_vine_swap_option.birthComp_.super__Function_base._M_functor._M_unused.
  _M_member_pointer =
       mc1.matrix_.super_Chain_vine_swap_option.birthComp_.super__Function_base._M_functor._M_unused
       ._M_member_pointer & 0xffffffffffffff00;
  mc1.colSettings_ = (Column_settings *)&PTR__lazy_ostream_00236020;
  mc1.matrix_.super_Chain_vine_swap_option.birthComp_.super__Function_base._M_functor._8_8_ =
       &boost::unit_test::lazy_ostream::inst;
  mc1.matrix_.super_Chain_vine_swap_option.birthComp_.super__Function_base._M_manager =
       (_Manager_type)&local_8d8;
  mr.matrix_.super_Chain_vine_swap_option.birthComp_.super__Function_base._M_manager =
       (_Manager_type)&local_918;
  local_7a8[0] = (int)mb.matrix_.matrix_._M_h._M_element_count == 7;
  boost::test_tools::tt_detail::report_assertion();
  boost::detail::shared_count::~shared_count((shared_count *)(local_7a8 + 0x10));
  local_180 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_178 = "";
  local_190 = &boost::unit_test::basic_cstring<char_const>::null;
  local_188 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_180,0x164);
  mc2.matrix_.super_Chain_vine_swap_option.birthComp_.super__Function_base._M_functor._M_unused.
  _M_member_pointer =
       mc2.matrix_.super_Chain_vine_swap_option.birthComp_.super__Function_base._M_functor._M_unused
       ._M_member_pointer & 0xffffffffffffff00;
  mc2.colSettings_ = (Column_settings *)&PTR__lazy_ostream_00236060;
  mc2.matrix_.super_Chain_vine_swap_option.birthComp_.super__Function_base._M_functor._8_8_ =
       &boost::unit_test::lazy_ostream::inst;
  mc2.matrix_.super_Chain_vine_swap_option.birthComp_.super__Function_base._M_manager =
       (_Manager_type)0x1f3264;
  auVar3._8_8_ = 0;
  auVar3._0_8_ = mb.matrix_.matrix_._M_h._M_bucket_count;
  uVar14 = SUB168((ZEXT816(0) << 0x40 | ZEXT816(2)) % auVar3,0);
  if (mb.matrix_.matrix_._M_h._M_buckets[uVar14 & 0xffffffff] != (__node_base_ptr)0x0) {
    p_Var2 = mb.matrix_.matrix_._M_h._M_buckets[uVar14 & 0xffffffff]->_M_nxt;
    uVar1 = *(uint *)&p_Var2[1]._M_nxt;
    do {
      if (uVar1 == 2) {
        local_8f0._0_4_ = *(int *)&p_Var2[4]._M_nxt;
        local_8b8._0_4_ = 0;
        local_7a8[0] = (int)local_8f0 == 0;
        local_7a8._8_8_ = (void *)0x0;
        local_7a8._16_8_ = 0;
        local_938 = (undefined4 ****)0x1f32e6;
        local_930 = "";
        local_918 = (undefined **)&local_8f0;
        mr.matrix_.super_Chain_vine_swap_option.birthComp_.super__Function_base._M_functor._M_unused
        ._M_member_pointer =
             mr.matrix_.super_Chain_vine_swap_option.birthComp_.super__Function_base._M_functor.
             _M_unused._M_member_pointer & 0xffffffffffffff00;
        mr.colSettings_ = (Column_settings *)&PTR__lazy_ostream_00236020;
        mr.matrix_.super_Chain_vine_swap_option.birthComp_.super__Function_base._M_functor._8_8_ =
             &boost::unit_test::lazy_ostream::inst;
        local_8d8 = &local_8b8;
        mc1.matrix_.super_Chain_vine_swap_option.birthComp_.super__Function_base._M_functor.
        _M_unused._M_member_pointer =
             mc1.matrix_.super_Chain_vine_swap_option.birthComp_.super__Function_base._M_functor.
             _M_unused._M_member_pointer & 0xffffffffffffff00;
        mc1.colSettings_ = (Column_settings *)&PTR__lazy_ostream_00236020;
        mc1.matrix_.super_Chain_vine_swap_option.birthComp_.super__Function_base._M_functor._8_8_ =
             &boost::unit_test::lazy_ostream::inst;
        mc1.matrix_.super_Chain_vine_swap_option.birthComp_.super__Function_base._M_manager =
             (_Manager_type)&local_8d8;
        mr.matrix_.super_Chain_vine_swap_option.birthComp_.super__Function_base._M_manager =
             (_Manager_type)&local_918;
        boost::test_tools::tt_detail::report_assertion
                  (local_7a8,&mc2,&local_938,0x164,1,2,2,"mb.get_column_dimension(2)",&mr,"0",&mc1);
        boost::detail::shared_count::~shared_count((shared_count *)(local_7a8 + 0x10));
        local_1a0 = 
        "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
        ;
        local_198 = "";
        local_1b0 = &boost::unit_test::basic_cstring<char_const>::null;
        local_1a8 = &boost::unit_test::basic_cstring<char_const>::null;
        boost::unit_test::unit_test_log_t::set_checkpoint
                  (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_1a0,0x165);
        mc2.matrix_.super_Chain_vine_swap_option.birthComp_.super__Function_base._M_functor.
        _M_unused._M_member_pointer =
             mc2.matrix_.super_Chain_vine_swap_option.birthComp_.super__Function_base._M_functor.
             _M_unused._M_member_pointer & 0xffffffffffffff00;
        mc2.colSettings_ = (Column_settings *)&PTR__lazy_ostream_00236060;
        mc2.matrix_.super_Chain_vine_swap_option.birthComp_.super__Function_base._M_functor._8_8_ =
             &boost::unit_test::lazy_ostream::inst;
        mc2.matrix_.super_Chain_vine_swap_option.birthComp_.super__Function_base._M_manager =
             (_Manager_type)0x1f3264;
        auVar4._8_8_ = 0;
        auVar4._0_8_ = mb.matrix_.matrix_._M_h._M_bucket_count;
        uVar14 = SUB168((ZEXT816(0) << 0x40 | ZEXT816(6)) % auVar4,0);
        if (mb.matrix_.matrix_._M_h._M_buckets[uVar14 & 0xffffffff] != (__node_base_ptr)0x0) {
          p_Var2 = mb.matrix_.matrix_._M_h._M_buckets[uVar14 & 0xffffffff]->_M_nxt;
          uVar1 = *(uint *)&p_Var2[1]._M_nxt;
          do {
            if (uVar1 == 6) {
              local_8f0 = (char *)CONCAT44(local_8f0._4_4_,*(int *)&p_Var2[4]._M_nxt);
              local_8b8 = (undefined4 **)CONCAT44(local_8b8._4_4_,2);
              local_7a8[0] = *(int *)&p_Var2[4]._M_nxt == 2;
              local_7a8._8_8_ = (void *)0x0;
              local_7a8._16_8_ = 0;
              local_938 = (undefined4 ****)0x1f32e6;
              local_930 = "";
              local_918 = (undefined **)&local_8f0;
              mr.matrix_.super_Chain_vine_swap_option.birthComp_.super__Function_base._M_functor.
              _M_unused._M_member_pointer =
                   mr.matrix_.super_Chain_vine_swap_option.birthComp_.super__Function_base.
                   _M_functor._M_unused._M_member_pointer & 0xffffffffffffff00;
              mr.colSettings_ = (Column_settings *)&PTR__lazy_ostream_00236020;
              mr.matrix_.super_Chain_vine_swap_option.birthComp_.super__Function_base._M_functor.
              _8_8_ = &boost::unit_test::lazy_ostream::inst;
              mc1.matrix_.super_Chain_vine_swap_option.birthComp_.super__Function_base._M_functor.
              _M_unused._M_member_pointer =
                   mc1.matrix_.super_Chain_vine_swap_option.birthComp_.super__Function_base.
                   _M_functor._M_unused._M_member_pointer & 0xffffffffffffff00;
              mc1.colSettings_ = (Column_settings *)&PTR__lazy_ostream_00236020;
              mc1.matrix_.super_Chain_vine_swap_option.birthComp_.super__Function_base._M_functor.
              _8_8_ = &boost::unit_test::lazy_ostream::inst;
              mc1.matrix_.super_Chain_vine_swap_option.birthComp_.super__Function_base._M_manager =
                   (_Manager_type)&local_8d8;
              local_8d8 = &local_8b8;
              mr.matrix_.super_Chain_vine_swap_option.birthComp_.super__Function_base._M_manager =
                   (_Manager_type)&local_918;
              boost::test_tools::tt_detail::report_assertion
                        (local_7a8,&mc2,&local_938,0x165,1,2,2,"mb.get_column_dimension(6)",&mr,"2",
                         &mc1);
              boost::detail::shared_count::~shared_count((shared_count *)(local_7a8 + 0x10));
              mc1.matrix_.super_Chain_vine_swap_option.birthComp_.super__Function_base._M_functor.
              _M_unused._M_object = (void *)0x0;
              mc1.colSettings_ = (Column_settings *)birth_comp;
              mc1.matrix_.super_Chain_vine_swap_option.birthComp_.super__Function_base._M_manager =
                   std::
                   _Function_handler<bool_(unsigned_int,_unsigned_int),_bool_(*)(unsigned_int,_unsigned_int)>
                   ::_M_invoke;
              mc1.matrix_.super_Chain_vine_swap_option.birthComp_.super__Function_base._M_functor.
              _8_8_ = std::
                      _Function_handler<bool_(unsigned_int,_unsigned_int),_bool_(*)(unsigned_int,_unsigned_int)>
                      ::_M_manager;
              mc2.matrix_.super_Chain_vine_swap_option.birthComp_.super__Function_base._M_functor.
              _M_unused._M_object = (void *)0x0;
              mc2.colSettings_ = (Column_settings *)death_comp;
              mc2.matrix_.super_Chain_vine_swap_option.birthComp_.super__Function_base._M_manager =
                   std::
                   _Function_handler<bool_(unsigned_int,_unsigned_int),_bool_(*)(unsigned_int,_unsigned_int)>
                   ::_M_invoke;
              mc2.matrix_.super_Chain_vine_swap_option.birthComp_.super__Function_base._M_functor.
              _8_8_ = std::
                      _Function_handler<bool_(unsigned_int,_unsigned_int),_bool_(*)(unsigned_int,_unsigned_int)>
                      ::_M_manager;
              mr.colSettings_ = (Column_settings *)operator_new(0x38);
              ((mr.colSettings_)->entryConstructor).entryPool_.
              super_pool<boost::default_user_allocator_malloc_free>.
              super_simple_segregated_storage<unsigned_long>.first = (void *)0x0;
              ((mr.colSettings_)->entryConstructor).entryPool_.
              super_pool<boost::default_user_allocator_malloc_free>.list.ptr = (char *)0x0;
              ((mr.colSettings_)->entryConstructor).entryPool_.
              super_pool<boost::default_user_allocator_malloc_free>.list.sz = 0;
              ((mr.colSettings_)->entryConstructor).entryPool_.
              super_pool<boost::default_user_allocator_malloc_free>.requested_size = 0x20;
              ((mr.colSettings_)->entryConstructor).entryPool_.
              super_pool<boost::default_user_allocator_malloc_free>.next_size = 0x20;
              ((mr.colSettings_)->entryConstructor).entryPool_.
              super_pool<boost::default_user_allocator_malloc_free>.start_size = 0x20;
              ((mr.colSettings_)->entryConstructor).entryPool_.
              super_pool<boost::default_user_allocator_malloc_free>.max_size = 0;
              Gudhi::persistence_matrix::
              Chain_matrix<Gudhi::persistence_matrix::Matrix<Chain_vine_options_with_row_access<(Gudhi::persistence_matrix::Column_types)7,true,false,false,false,true,false,false>>>
              ::
              Chain_matrix<std::function<bool(unsigned_int,unsigned_int)>,std::function<bool(unsigned_int,unsigned_int)>>
                        ((Chain_matrix<Gudhi::persistence_matrix::Matrix<Chain_vine_options_with_row_access<(Gudhi::persistence_matrix::Column_types)7,true,false,false,false,true,false,false>>>
                          *)&mr.matrix_,5,mr.colSettings_,
                         (function<bool_(unsigned_int,_unsigned_int)> *)&mc1,
                         (function<bool_(unsigned_int,_unsigned_int)> *)&mc2);
              if (mc2.matrix_.super_Chain_vine_swap_option.birthComp_.super__Function_base.
                  _M_functor._8_8_ != 0) {
                (*(code *)mc2.matrix_.super_Chain_vine_swap_option.birthComp_.super__Function_base.
                          _M_functor._8_8_)(&mc2,&mc2,3);
              }
              if (mc1.matrix_.super_Chain_vine_swap_option.birthComp_.super__Function_base.
                  _M_functor._8_8_ != 0) {
                (*(code *)mc1.matrix_.super_Chain_vine_swap_option.birthComp_.super__Function_base.
                          _M_functor._8_8_)(&mc1,&mc1,3);
              }
              local_1c0 = 
              "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
              ;
              local_1b8 = "";
              local_1d0 = &boost::unit_test::basic_cstring<char_const>::null;
              local_1c8 = &boost::unit_test::basic_cstring<char_const>::null;
              boost::unit_test::unit_test_log_t::set_checkpoint
                        (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_1c0,0x169);
              local_7a8._8_8_ = local_7a8._8_8_ & 0xffffffffffffff00;
              local_7a8._0_8_ = &PTR__lazy_ostream_00236060;
              local_7a8._16_8_ = &boost::unit_test::lazy_ostream::inst;
              local_790 = (undefined4 ***)0x1f3264;
              local_8b8 = (undefined4 **)
                          CONCAT44(local_8b8._4_4_,(int)mr.matrix_.matrix_._M_h._M_element_count);
              local_8f0 = (char *)&local_948;
              local_938 = (undefined4 ****)
                          CONCAT71(local_938._1_7_,
                                   (int)mr.matrix_.matrix_._M_h._M_element_count == 0);
              local_948 = (int *)((ulong)local_948._4_4_ << 0x20);
              local_930 = (char *)0x0;
              sStack_928.pi_ = (sp_counted_base *)0x0;
              local_918 = (undefined **)0x1f32e6;
              local_910 = "";
              local_8d8 = &local_8b8;
              mc1.matrix_.super_Chain_vine_swap_option.birthComp_.super__Function_base._M_functor.
              _M_unused._M_member_pointer =
                   mc1.matrix_.super_Chain_vine_swap_option.birthComp_.super__Function_base.
                   _M_functor._M_unused._M_member_pointer & 0xffffffffffffff00;
              mc1.colSettings_ = (Column_settings *)&PTR__lazy_ostream_00235fd0;
              mc1.matrix_.super_Chain_vine_swap_option.birthComp_.super__Function_base._M_functor.
              _8_8_ = &boost::unit_test::lazy_ostream::inst;
              mc1.matrix_.super_Chain_vine_swap_option.birthComp_.super__Function_base._M_manager =
                   (_Manager_type)&local_8d8;
              mc2.matrix_.super_Chain_vine_swap_option.birthComp_.super__Function_base._M_functor.
              _M_unused._M_member_pointer =
                   mc2.matrix_.super_Chain_vine_swap_option.birthComp_.super__Function_base.
                   _M_functor._M_unused._M_member_pointer & 0xffffffffffffff00;
              mc2.colSettings_ = (Column_settings *)&PTR__lazy_ostream_00236020;
              mc2.matrix_.super_Chain_vine_swap_option.birthComp_.super__Function_base._M_functor.
              _8_8_ = &boost::unit_test::lazy_ostream::inst;
              mc2.matrix_.super_Chain_vine_swap_option.birthComp_.super__Function_base._M_manager =
                   (_Manager_type)&local_8f0;
              boost::test_tools::tt_detail::report_assertion
                        (&local_938,local_7a8,&local_918,0x169,1,2,2,"mr.get_number_of_columns()",
                         &mc1,"0",&mc2);
              boost::detail::shared_count::~shared_count(&sStack_928);
              mc1.colSettings_ = (Column_settings *)operator_new(0x38);
              ((mc1.colSettings_)->entryConstructor).entryPool_.
              super_pool<boost::default_user_allocator_malloc_free>.
              super_simple_segregated_storage<unsigned_long>.first = (void *)0x0;
              ((mc1.colSettings_)->entryConstructor).entryPool_.
              super_pool<boost::default_user_allocator_malloc_free>.list.ptr = (char *)0x0;
              ((mc1.colSettings_)->entryConstructor).entryPool_.
              super_pool<boost::default_user_allocator_malloc_free>.list.sz = 0;
              ((mc1.colSettings_)->entryConstructor).entryPool_.
              super_pool<boost::default_user_allocator_malloc_free>.requested_size = 0x20;
              ((mc1.colSettings_)->entryConstructor).entryPool_.
              super_pool<boost::default_user_allocator_malloc_free>.next_size = 0x20;
              ((mc1.colSettings_)->entryConstructor).entryPool_.
              super_pool<boost::default_user_allocator_malloc_free>.start_size = 0x20;
              ((mc1.colSettings_)->entryConstructor).entryPool_.
              super_pool<boost::default_user_allocator_malloc_free>.max_size = 0;
              Gudhi::persistence_matrix::
              Chain_matrix<Gudhi::persistence_matrix::Matrix<Chain_vine_options_with_row_access<(Gudhi::persistence_matrix::Column_types)7,_true,_false,_false,_false,_true,_false,_false>_>_>
              ::Chain_matrix(&mc1.matrix_,&mb.matrix_,mc1.colSettings_);
              mc2.colSettings_ = (Column_settings *)operator_new(0x38);
              ((mc2.colSettings_)->entryConstructor).entryPool_.
              super_pool<boost::default_user_allocator_malloc_free>.
              super_simple_segregated_storage<unsigned_long>.first = (void *)0x0;
              ((mc2.colSettings_)->entryConstructor).entryPool_.
              super_pool<boost::default_user_allocator_malloc_free>.list.ptr = (char *)0x0;
              ((mc2.colSettings_)->entryConstructor).entryPool_.
              super_pool<boost::default_user_allocator_malloc_free>.list.sz = 0;
              ((mc2.colSettings_)->entryConstructor).entryPool_.
              super_pool<boost::default_user_allocator_malloc_free>.requested_size = 0x20;
              ((mc2.colSettings_)->entryConstructor).entryPool_.
              super_pool<boost::default_user_allocator_malloc_free>.next_size = 0x20;
              ((mc2.colSettings_)->entryConstructor).entryPool_.
              super_pool<boost::default_user_allocator_malloc_free>.start_size = 0x20;
              ((mc2.colSettings_)->entryConstructor).entryPool_.
              super_pool<boost::default_user_allocator_malloc_free>.max_size = 0;
              Gudhi::persistence_matrix::
              Chain_matrix<Gudhi::persistence_matrix::Matrix<Chain_vine_options_with_row_access<(Gudhi::persistence_matrix::Column_types)7,_true,_false,_false,_false,_true,_false,_false>_>_>
              ::Chain_matrix(&mc2.matrix_,&mb.matrix_,mc2.colSettings_);
              local_1e0 = 
              "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
              ;
              local_1d8 = "";
              local_1f0 = &boost::unit_test::basic_cstring<char_const>::null;
              local_1e8 = &boost::unit_test::basic_cstring<char_const>::null;
              boost::unit_test::unit_test_log_t::set_checkpoint
                        (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_1e0,0x16e);
              local_910 = (char *)((ulong)local_910 & 0xffffffffffffff00);
              local_918 = &PTR__lazy_ostream_00236060;
              local_908 = &boost::unit_test::lazy_ostream::inst;
              local_900 = (undefined4 **)0x1f3264;
              local_8b8 = &local_940;
              local_948 = &local_94c;
              local_94c = 7;
              local_8d0 = 0;
              sStack_8c8.pi_ = (sp_counted_base *)0x0;
              local_8f0 = 
              "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
              ;
              local_8e8 = "";
              local_7a8._8_8_ = local_7a8._8_8_ & 0xffffffffffffff00;
              local_7a8._0_8_ = &PTR__lazy_ostream_00235fd0;
              local_7a8._16_8_ = &boost::unit_test::lazy_ostream::inst;
              local_930 = (char *)((ulong)local_930 & 0xffffffffffffff00);
              local_938 = (undefined4 ****)&PTR__lazy_ostream_00236020;
              sStack_928.pi_ = (sp_counted_base *)&boost::unit_test::lazy_ostream::inst;
              local_920 = &local_948;
              local_790 = &local_8b8;
              local_8d8._0_1_ = (int)mc1.matrix_.matrix_._M_h._M_element_count == 7;
              boost::test_tools::tt_detail::report_assertion();
              boost::detail::shared_count::~shared_count(&sStack_8c8);
              local_200 = 
              "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
              ;
              local_1f8 = "";
              local_210 = &boost::unit_test::basic_cstring<char_const>::null;
              local_208 = &boost::unit_test::basic_cstring<char_const>::null;
              boost::unit_test::unit_test_log_t::set_checkpoint
                        (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_200,0x16f);
              local_910 = (char *)((ulong)local_910 & 0xffffffffffffff00);
              local_918 = &PTR__lazy_ostream_00236060;
              local_908 = &boost::unit_test::lazy_ostream::inst;
              local_900 = (undefined4 **)0x1f3264;
              auVar5._8_8_ = 0;
              auVar5._0_8_ = mc1.matrix_.matrix_._M_h._M_bucket_count;
              uVar14 = SUB168((ZEXT816(0) << 0x40 | ZEXT816(2)) % auVar5,0);
              if (mc1.matrix_.matrix_._M_h._M_buckets[uVar14 & 0xffffffff] != (__node_base_ptr)0x0)
              {
                p_Var2 = mc1.matrix_.matrix_._M_h._M_buckets[uVar14 & 0xffffffff]->_M_nxt;
                uVar1 = *(uint *)&p_Var2[1]._M_nxt;
                do {
                  if (uVar1 == 2) {
                    local_940._0_4_ = *(int *)&p_Var2[4]._M_nxt;
                    local_94c = 0;
                    local_8d8._0_1_ = (int)local_940 == 0;
                    local_8d0 = 0;
                    sStack_8c8.pi_ = (sp_counted_base *)0x0;
                    local_8f0 = 
                    "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
                    ;
                    local_8e8 = "";
                    local_8b8 = &local_940;
                    local_7a8._8_8_ = local_7a8._8_8_ & 0xffffffffffffff00;
                    local_7a8._0_8_ = &PTR__lazy_ostream_00236020;
                    local_7a8._16_8_ = &boost::unit_test::lazy_ostream::inst;
                    local_948 = &local_94c;
                    local_930 = (char *)((ulong)local_930 & 0xffffffffffffff00);
                    local_938 = (undefined4 ****)&PTR__lazy_ostream_00236020;
                    sStack_928.pi_ = (sp_counted_base *)&boost::unit_test::lazy_ostream::inst;
                    local_920 = &local_948;
                    local_790 = &local_8b8;
                    boost::test_tools::tt_detail::report_assertion
                              (&local_8d8,&local_918,&local_8f0,0x16f,1,2,2,
                               "mc1.get_column_dimension(2)",local_7a8,"0",&local_938);
                    boost::detail::shared_count::~shared_count(&sStack_8c8);
                    local_220 = 
                    "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
                    ;
                    local_218 = "";
                    local_230 = &boost::unit_test::basic_cstring<char_const>::null;
                    local_228 = &boost::unit_test::basic_cstring<char_const>::null;
                    boost::unit_test::unit_test_log_t::set_checkpoint
                              (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_220,
                               0x170);
                    local_910 = (char *)((ulong)local_910 & 0xffffffffffffff00);
                    local_918 = &PTR__lazy_ostream_00236060;
                    local_908 = &boost::unit_test::lazy_ostream::inst;
                    local_900 = (undefined4 **)0x1f3264;
                    auVar6._8_8_ = 0;
                    auVar6._0_8_ = mc1.matrix_.matrix_._M_h._M_bucket_count;
                    uVar14 = SUB168((ZEXT816(0) << 0x40 | ZEXT816(6)) % auVar6,0);
                    if (mc1.matrix_.matrix_._M_h._M_buckets[uVar14 & 0xffffffff] !=
                        (__node_base_ptr)0x0) {
                      p_Var2 = mc1.matrix_.matrix_._M_h._M_buckets[uVar14 & 0xffffffff]->_M_nxt;
                      uVar1 = *(uint *)&p_Var2[1]._M_nxt;
                      do {
                        if (uVar1 == 6) {
                          local_940._0_4_ = *(int *)&p_Var2[4]._M_nxt;
                          local_94c = 2;
                          local_8d8._0_1_ = (int)local_940 == 2;
                          local_8d0 = 0;
                          sStack_8c8.pi_ = (sp_counted_base *)0x0;
                          local_8f0 = 
                          "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
                          ;
                          local_8e8 = "";
                          local_8b8 = &local_940;
                          local_7a8._8_8_ = local_7a8._8_8_ & 0xffffffffffffff00;
                          local_7a8._0_8_ = &PTR__lazy_ostream_00236020;
                          local_7a8._16_8_ = &boost::unit_test::lazy_ostream::inst;
                          local_948 = &local_94c;
                          local_930 = (char *)((ulong)local_930 & 0xffffffffffffff00);
                          local_938 = (undefined4 ****)&PTR__lazy_ostream_00236020;
                          sStack_928.pi_ = (sp_counted_base *)&boost::unit_test::lazy_ostream::inst;
                          local_920 = &local_948;
                          local_790 = &local_8b8;
                          boost::test_tools::tt_detail::report_assertion
                                    (&local_8d8,&local_918,&local_8f0,0x170,1,2,2,
                                     "mc1.get_column_dimension(6)",local_7a8,"2",&local_938);
                          boost::detail::shared_count::~shared_count(&sStack_8c8);
                          local_240 = 
                          "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
                          ;
                          local_238 = "";
                          local_250 = &boost::unit_test::basic_cstring<char_const>::null;
                          local_248 = &boost::unit_test::basic_cstring<char_const>::null;
                          boost::unit_test::unit_test_log_t::set_checkpoint
                                    (boost::unit_test::(anonymous_namespace)::unit_test_log,
                                     &local_240,0x171);
                          local_910 = (char *)((ulong)local_910 & 0xffffffffffffff00);
                          local_918 = &PTR__lazy_ostream_00236060;
                          local_908 = &boost::unit_test::lazy_ostream::inst;
                          local_900 = (undefined4 **)0x1f3264;
                          local_8d8._0_1_ = (int)mc2.matrix_.matrix_._M_h._M_element_count == 7;
                          local_94c = 7;
                          local_8d0 = 0;
                          sStack_8c8.pi_ = (sp_counted_base *)0x0;
                          local_8f0 = 
                          "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
                          ;
                          local_8e8 = "";
                          local_8b8 = &local_940;
                          local_7a8._8_8_ = local_7a8._8_8_ & 0xffffffffffffff00;
                          local_7a8._0_8_ = &PTR__lazy_ostream_00235fd0;
                          local_7a8._16_8_ = &boost::unit_test::lazy_ostream::inst;
                          local_948 = &local_94c;
                          local_930 = (char *)((ulong)local_930 & 0xffffffffffffff00);
                          local_938 = (undefined4 ****)&PTR__lazy_ostream_00236020;
                          sStack_928.pi_ = (sp_counted_base *)&boost::unit_test::lazy_ostream::inst;
                          local_920 = &local_948;
                          local_790 = &local_8b8;
                          boost::test_tools::tt_detail::report_assertion();
                          boost::detail::shared_count::~shared_count(&sStack_8c8);
                          local_260 = 
                          "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
                          ;
                          local_258 = "";
                          local_270 = &boost::unit_test::basic_cstring<char_const>::null;
                          local_268 = &boost::unit_test::basic_cstring<char_const>::null;
                          boost::unit_test::unit_test_log_t::set_checkpoint
                                    (boost::unit_test::(anonymous_namespace)::unit_test_log,
                                     &local_260,0x172);
                          local_910 = (char *)((ulong)local_910 & 0xffffffffffffff00);
                          local_918 = &PTR__lazy_ostream_00236060;
                          local_908 = &boost::unit_test::lazy_ostream::inst;
                          local_900 = (undefined4 **)0x1f3264;
                          auVar7._8_8_ = 0;
                          auVar7._0_8_ = mc2.matrix_.matrix_._M_h._M_bucket_count;
                          uVar14 = SUB168((ZEXT816(0) << 0x40 | ZEXT816(2)) % auVar7,0);
                          if (mc2.matrix_.matrix_._M_h._M_buckets[uVar14 & 0xffffffff] !=
                              (__node_base_ptr)0x0) {
                            p_Var2 = mc2.matrix_.matrix_._M_h._M_buckets[uVar14 & 0xffffffff]->
                                     _M_nxt;
                            uVar1 = *(uint *)&p_Var2[1]._M_nxt;
                            do {
                              if (uVar1 == 2) {
                                local_940._0_4_ = *(int *)&p_Var2[4]._M_nxt;
                                local_94c = 0;
                                local_8d8._0_1_ = (int)local_940 == 0;
                                local_8d0 = 0;
                                sStack_8c8.pi_ = (sp_counted_base *)0x0;
                                local_8f0 = 
                                "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
                                ;
                                local_8e8 = "";
                                local_8b8 = &local_940;
                                local_7a8._8_8_ = local_7a8._8_8_ & 0xffffffffffffff00;
                                local_7a8._0_8_ = &PTR__lazy_ostream_00236020;
                                local_7a8._16_8_ = &boost::unit_test::lazy_ostream::inst;
                                local_948 = &local_94c;
                                local_930 = (char *)((ulong)local_930 & 0xffffffffffffff00);
                                local_938 = (undefined4 ****)&PTR__lazy_ostream_00236020;
                                sStack_928.pi_ =
                                     (sp_counted_base *)&boost::unit_test::lazy_ostream::inst;
                                local_920 = &local_948;
                                local_790 = &local_8b8;
                                boost::test_tools::tt_detail::report_assertion
                                          (&local_8d8,&local_918,&local_8f0,0x172,1,2,2,
                                           "mc2.get_column_dimension(2)",local_7a8,"0",&local_938);
                                boost::detail::shared_count::~shared_count(&sStack_8c8);
                                local_280 = 
                                "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
                                ;
                                local_278 = "";
                                local_290 = &boost::unit_test::basic_cstring<char_const>::null;
                                local_288 = &boost::unit_test::basic_cstring<char_const>::null;
                                boost::unit_test::unit_test_log_t::set_checkpoint
                                          (boost::unit_test::(anonymous_namespace)::unit_test_log,
                                           &local_280,0x173);
                                local_910 = (char *)((ulong)local_910 & 0xffffffffffffff00);
                                local_918 = &PTR__lazy_ostream_00236060;
                                local_908 = &boost::unit_test::lazy_ostream::inst;
                                local_900 = (undefined4 **)0x1f3264;
                                auVar8._8_8_ = 0;
                                auVar8._0_8_ = mc2.matrix_.matrix_._M_h._M_bucket_count;
                                uVar14 = SUB168((ZEXT816(0) << 0x40 | ZEXT816(6)) % auVar8,0);
                                if (mc2.matrix_.matrix_._M_h._M_buckets[uVar14 & 0xffffffff] !=
                                    (__node_base_ptr)0x0) {
                                  p_Var2 = mc2.matrix_.matrix_._M_h._M_buckets[uVar14 & 0xffffffff]
                                           ->_M_nxt;
                                  uVar1 = *(uint *)&p_Var2[1]._M_nxt;
                                  do {
                                    if (uVar1 == 6) {
                                      local_940 = (undefined4 *)
                                                  CONCAT44(local_940._4_4_,*(int *)&p_Var2[4]._M_nxt
                                                          );
                                      local_94c = 2;
                                      local_8d8 = (undefined4 ***)
                                                  CONCAT71(local_8d8._1_7_,
                                                           *(int *)&p_Var2[4]._M_nxt == 2);
                                      local_8d0 = 0;
                                      sStack_8c8.pi_ = (sp_counted_base *)0x0;
                                      local_8f0 = 
                                      "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
                                      ;
                                      local_8e8 = "";
                                      local_8b8 = &local_940;
                                      local_7a8._8_8_ = local_7a8._8_8_ & 0xffffffffffffff00;
                                      local_7a8._0_8_ = &PTR__lazy_ostream_00236020;
                                      local_7a8._16_8_ = &boost::unit_test::lazy_ostream::inst;
                                      local_948 = &local_94c;
                                      local_930 = (char *)((ulong)local_930 & 0xffffffffffffff00);
                                      local_938 = (undefined4 ****)&PTR__lazy_ostream_00236020;
                                      sStack_928.pi_ =
                                           (sp_counted_base *)&boost::unit_test::lazy_ostream::inst;
                                      local_920 = &local_948;
                                      local_790 = &local_8b8;
                                      boost::test_tools::tt_detail::report_assertion
                                                (&local_8d8,&local_918,&local_8f0,0x173,1,2,2,
                                                 "mc2.get_column_dimension(6)",local_7a8,"2",
                                                 &local_938);
                                      boost::detail::shared_count::~shared_count(&sStack_8c8);
                                      local_7a8._0_8_ = mb.colSettings_;
                                      mb.colSettings_ = (Column_settings *)0x0;
                                      local_7a8._8_8_ = (void *)0x0;
                                      local_7a8._16_8_ = 0;
                                      local_790 = (undefined4 ***)0x0;
                                      local_788 = mb.matrix_.super_Chain_vine_swap_option.birthComp_
                                                  ._M_invoker;
                                      if (mb.matrix_.super_Chain_vine_swap_option.birthComp_.
                                          super__Function_base._M_manager != (_Manager_type)0x0) {
                                        local_7a8._8_8_ =
                                             mb.matrix_.super_Chain_vine_swap_option.birthComp_.
                                             super__Function_base._M_functor._M_unused._M_object;
                                        local_7a8._16_8_ =
                                             mb.matrix_.super_Chain_vine_swap_option.birthComp_.
                                             super__Function_base._M_functor._8_8_;
                                        local_790 = (undefined4 ***)
                                                    mb.matrix_.super_Chain_vine_swap_option.
                                                    birthComp_.super__Function_base._M_manager;
                                        mb.matrix_.super_Chain_vine_swap_option.birthComp_.
                                        super__Function_base._M_manager = (_Manager_type)0x0;
                                        mb.matrix_.super_Chain_vine_swap_option.birthComp_.
                                        _M_invoker = (_Invoker_type)0x0;
                                      }
                                      local_780._M_unused._M_object = (void *)0x0;
                                      local_780._8_8_ = 0;
                                      local_770 = (_Manager_type)0x0;
                                      local_768 = mb.matrix_.super_Chain_vine_swap_option.deathComp_
                                                  ._M_invoker;
                                      if (mb.matrix_.super_Chain_vine_swap_option.deathComp_.
                                          super__Function_base._M_manager != (_Manager_type)0x0) {
                                        local_780._M_unused._M_object =
                                             mb.matrix_.super_Chain_vine_swap_option.deathComp_.
                                             super__Function_base._M_functor._M_unused._M_object;
                                        local_780._8_8_ =
                                             mb.matrix_.super_Chain_vine_swap_option.deathComp_.
                                             super__Function_base._M_functor._8_8_;
                                        local_770 = mb.matrix_.super_Chain_vine_swap_option.
                                                    deathComp_.super__Function_base._M_manager;
                                        mb.matrix_.super_Chain_vine_swap_option.deathComp_.
                                        super__Function_base._M_manager = (_Manager_type)0x0;
                                        mb.matrix_.super_Chain_vine_swap_option.deathComp_.
                                        _M_invoker = (_Invoker_type)0x0;
                                      }
                                      local_760 = mb.matrix_.
                                                  super_Chain_representative_cycles_option.
                                                  representativeCycles_.
                                                  super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_start;
                                      pvStack_758 = mb.matrix_.
                                                    super_Chain_representative_cycles_option.
                                                    representativeCycles_.
                                                                                                        
                                                  super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_finish;
                                      local_750 = mb.matrix_.
                                                  super_Chain_representative_cycles_option.
                                                  representativeCycles_.
                                                  super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                      ;
                                      mb.matrix_.super_Chain_representative_cycles_option.
                                      representativeCycles_.
                                      super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                                      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
                                      mb.matrix_.super_Chain_representative_cycles_option.
                                      representativeCycles_.
                                      super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                                      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
                                      mb.matrix_.super_Chain_representative_cycles_option.
                                      representativeCycles_.
                                      super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                                      ._M_impl.super__Vector_impl_data._M_end_of_storage =
                                           (pointer)0x0;
                                      local_748 = mb.matrix_.
                                                  super_Chain_representative_cycles_option.
                                                  birthToCycle_.
                                                  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                                  ._M_impl.super__Vector_impl_data._M_start;
                                      puStack_740 = mb.matrix_.
                                                    super_Chain_representative_cycles_option.
                                                    birthToCycle_.
                                                                                                        
                                                  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                                  ._M_impl.super__Vector_impl_data._M_finish;
                                      local_738 = mb.matrix_.
                                                  super_Chain_representative_cycles_option.
                                                  birthToCycle_.
                                                  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                                  ._0_4_;
                                      uStack_734 = mb.matrix_.
                                                   super_Chain_representative_cycles_option.
                                                   birthToCycle_.
                                                                                                      
                                                  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                                  ._4_4_;
                                      uStack_730 = mb.matrix_.super_Matrix_row_access_option.rows_.
                                                   _0_4_;
                                      uStack_72c = mb.matrix_.super_Matrix_row_access_option.rows_.
                                                   _4_4_;
                                      mb.matrix_.super_Chain_representative_cycles_option.
                                      birthToCycle_.
                                      super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
                                      mb.matrix_.super_Chain_representative_cycles_option.
                                      birthToCycle_.
                                      super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
                                      mb.matrix_.super_Chain_representative_cycles_option.
                                      birthToCycle_.
                                      super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                      ._M_impl.super__Vector_impl_data._M_end_of_storage =
                                           (pointer)0x0;
                                      mb.matrix_.super_Matrix_row_access_option.rows_ =
                                           (vector<std::set<Gudhi::persistence_matrix::Entry<Gudhi::persistence_matrix::Matrix<Chain_vine_options_with_row_access<(Gudhi::persistence_matrix::Column_types)7,_true,_false,_false,_false,_true,_false,_false>_>_>,_Gudhi::persistence_matrix::Matrix<Chain_vine_options_with_row_access<(Gudhi::persistence_matrix::Column_types)7,_true,_false,_false,_false,_true,_false,_false>_>::RowEntryComp,_std::allocator<Gudhi::persistence_matrix::Entry<Gudhi::persistence_matrix::Matrix<Chain_vine_options_with_row_access<(Gudhi::persistence_matrix::Column_types)7,_true,_false,_false,_false,_true,_false,_false>_>_>_>_>,_std::allocator<std::set<Gudhi::persistence_matrix::Entry<Gudhi::persistence_matrix::Matrix<Chain_vine_options_with_row_access<(Gudhi::persistence_matrix::Column_types)7,_true,_false,_false,_false,_true,_false,_false>_>_>,_Gudhi::persistence_matrix::Matrix<Chain_vine_options_with_row_access<(Gudhi::persistence_matrix::Column_types)7,_true,_false,_false,_false,_true,_false,_false>_>::RowEntryComp,_std::allocator<Gudhi::persistence_matrix::Entry<Gudhi::persistence_matrix::Matrix<Chain_vine_options_with_row_access<(Gudhi::persistence_matrix::Column_types)7,_true,_false,_false,_false,_true,_false,_false>_>_>_>_>_>_>
                                            *)0x0;
                                      std::
                                      _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Chain_vine_options_with_row_access<(Gudhi::persistence_matrix::Column_types)7,_true,_false,_false,_false,_true,_false,_false>_>_>_>,_std::allocator<std::pair<const_unsigned_int,_Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Chain_vine_options_with_row_access<(Gudhi::persistence_matrix::Column_types)7,_true,_false,_false,_false,_true,_false,_false>_>_>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                                      ::_Hashtable(&local_728,&mb.matrix_.matrix_);
                                      std::
                                      _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                                      ::_Hashtable(&_Stack_6f0,&mb.matrix_.pivotToColumnIndex_);
                                      local_6b0 = mb.matrix_.colSettings_;
                                      local_6b8 = mb.matrix_.nextIndex_;
                                      mb.matrix_.nextIndex_ = 0;
                                      mb.matrix_.colSettings_ = (Column_settings *)0x0;
                                      local_2a0 = 
                                      "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
                                      ;
                                      local_298 = "";
                                      local_2b0 = &boost::unit_test::basic_cstring<char_const>::null
                                      ;
                                      local_2a8 = &boost::unit_test::basic_cstring<char_const>::null
                                      ;
                                      boost::unit_test::unit_test_log_t::set_checkpoint
                                                (boost::unit_test::(anonymous_namespace)::
                                                 unit_test_log,&local_2a0,0x177);
                                      local_8d0 = local_8d0 & 0xffffffffffffff00;
                                      local_8d8 = (undefined4 ***)&PTR__lazy_ostream_00236060;
                                      sStack_8c8.pi_ =
                                           (sp_counted_base *)&boost::unit_test::lazy_ostream::inst;
                                      local_8c0 = "";
                                      local_94c = (int)local_728._M_element_count;
                                      local_8f4 = 7;
                                      local_8e8 = (char *)0x0;
                                      sStack_8e0.pi_ = (sp_counted_base *)0x0;
                                      local_8b8 = (undefined4 **)0x1f32e6;
                                      local_8b0 = "";
                                      local_948 = &local_94c;
                                      local_930 = (char *)((ulong)local_930 & 0xffffffffffffff00);
                                      local_938 = (undefined4 ****)&PTR__lazy_ostream_00235fd0;
                                      sStack_928.pi_ =
                                           (sp_counted_base *)&boost::unit_test::lazy_ostream::inst;
                                      local_920 = &local_948;
                                      local_910 = (char *)((ulong)local_910 & 0xffffffffffffff00);
                                      local_918 = &PTR__lazy_ostream_00236020;
                                      local_908 = &boost::unit_test::lazy_ostream::inst;
                                      local_900 = &local_940;
                                      local_940 = &local_8f4;
                                      local_8f0._0_1_ =
                                           (_func_bool__Any_data_ptr__Any_data_ptr__Manager_operation
                                            )((int)local_728._M_element_count == 7);
                                      boost::test_tools::tt_detail::report_assertion();
                                      boost::detail::shared_count::~shared_count(&sStack_8e0);
                                      local_2c0 = 
                                      "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
                                      ;
                                      local_2b8 = "";
                                      local_2d0 = &boost::unit_test::basic_cstring<char_const>::null
                                      ;
                                      local_2c8 = &boost::unit_test::basic_cstring<char_const>::null
                                      ;
                                      boost::unit_test::unit_test_log_t::set_checkpoint
                                                (boost::unit_test::(anonymous_namespace)::
                                                 unit_test_log,&local_2c0,0x178);
                                      local_8d0 = local_8d0 & 0xffffffffffffff00;
                                      local_8d8 = (undefined4 ***)&PTR__lazy_ostream_00236060;
                                      sStack_8c8.pi_ =
                                           (sp_counted_base *)&boost::unit_test::lazy_ostream::inst;
                                      local_8c0 = "";
                                      auVar9._8_8_ = 0;
                                      auVar9._0_8_ = local_728._M_bucket_count;
                                      uVar14 = SUB168((ZEXT816(0) << 0x40 | ZEXT816(2)) % auVar9,0);
                                      if (local_728._M_buckets[uVar14 & 0xffffffff] !=
                                          (__node_base_ptr)0x0) {
                                        p_Var2 = local_728._M_buckets[uVar14 & 0xffffffff]->_M_nxt;
                                        uVar1 = *(uint *)&p_Var2[1]._M_nxt;
                                        do {
                                          if (uVar1 == 2) {
                                            local_94c = *(int *)&p_Var2[4]._M_nxt;
                                            local_8f4 = 0;
                                            local_8f0._0_1_ =
                                                 (_func_bool__Any_data_ptr__Any_data_ptr__Manager_operation
                                                  )(local_94c == 0);
                                            local_8e8 = (char *)0x0;
                                            sStack_8e0.pi_ = (sp_counted_base *)0x0;
                                            local_8b8 = (undefined4 **)0x1f32e6;
                                            local_8b0 = "";
                                            local_948 = &local_94c;
                                            local_930 = (char *)((ulong)local_930 &
                                                                0xffffffffffffff00);
                                            local_938 = (undefined4 ****)&PTR__lazy_ostream_00236020
                                            ;
                                            sStack_928.pi_ =
                                                 (sp_counted_base *)
                                                 &boost::unit_test::lazy_ostream::inst;
                                            local_920 = &local_948;
                                            local_910 = (char *)((ulong)local_910 &
                                                                0xffffffffffffff00);
                                            local_918 = &PTR__lazy_ostream_00236020;
                                            local_908 = &boost::unit_test::lazy_ostream::inst;
                                            local_900 = &local_940;
                                            local_940 = &local_8f4;
                                            boost::test_tools::tt_detail::report_assertion
                                                      (&local_8f0,&local_8d8,&local_8b8,0x178,1,2,2,
                                                       "mm.get_column_dimension(2)",&local_938,"0",
                                                       &local_918);
                                            boost::detail::shared_count::~shared_count(&sStack_8e0);
                                            local_2e0 = 
                                            "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
                                            ;
                                            local_2d8 = "";
                                            local_2f0 = &boost::unit_test::basic_cstring<char_const>
                                                         ::null;
                                            local_2e8 = &boost::unit_test::basic_cstring<char_const>
                                                         ::null;
                                            boost::unit_test::unit_test_log_t::set_checkpoint
                                                      (boost::unit_test::(anonymous_namespace)::
                                                       unit_test_log,&local_2e0,0x179);
                                            local_8d0 = local_8d0 & 0xffffffffffffff00;
                                            local_8d8 = (undefined4 ***)&PTR__lazy_ostream_00236060;
                                            sStack_8c8.pi_ =
                                                 (sp_counted_base *)
                                                 &boost::unit_test::lazy_ostream::inst;
                                            local_8c0 = "";
                                            auVar10._8_8_ = 0;
                                            auVar10._0_8_ = local_728._M_bucket_count;
                                            uVar14 = SUB168((ZEXT816(0) << 0x40 | ZEXT816(6)) %
                                                            auVar10,0);
                                            if (local_728._M_buckets[uVar14 & 0xffffffff] !=
                                                (__node_base_ptr)0x0) {
                                              p_Var2 = local_728._M_buckets[uVar14 & 0xffffffff]->
                                                       _M_nxt;
                                              uVar1 = *(uint *)&p_Var2[1]._M_nxt;
                                              do {
                                                if (uVar1 == 6) {
                                                  local_94c = *(int *)&p_Var2[4]._M_nxt;
                                                  local_8f4 = 2;
                                                  local_8f0._0_1_ =
                                                       (
                                                  _func_bool__Any_data_ptr__Any_data_ptr__Manager_operation
                                                  )(local_94c == 2);
                                                  local_8e8 = (char *)0x0;
                                                  sStack_8e0.pi_ = (sp_counted_base *)0x0;
                                                  local_8b8 = (undefined4 **)0x1f32e6;
                                                  local_8b0 = "";
                                                  local_948 = &local_94c;
                                                  local_930 = (char *)((ulong)local_930 &
                                                                      0xffffffffffffff00);
                                                  local_938 = (undefined4 ****)
                                                              &PTR__lazy_ostream_00236020;
                                                  sStack_928.pi_ =
                                                       (sp_counted_base *)
                                                       &boost::unit_test::lazy_ostream::inst;
                                                  local_920 = &local_948;
                                                  local_910 = (char *)((ulong)local_910 &
                                                                      0xffffffffffffff00);
                                                  local_918 = &PTR__lazy_ostream_00236020;
                                                  local_908 = &boost::unit_test::lazy_ostream::inst;
                                                  local_900 = &local_940;
                                                  local_940 = &local_8f4;
                                                  boost::test_tools::tt_detail::report_assertion
                                                            (&local_8f0,&local_8d8,&local_8b8,0x179,
                                                             1,2,2,"mm.get_column_dimension(6)",
                                                             &local_938,"2",&local_918);
                                                  boost::detail::shared_count::~shared_count
                                                            (&sStack_8e0);
                                                  local_300 = 
                                                  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
                                                  ;
                                                  local_2f8 = "";
                                                  local_310 = &boost::unit_test::
                                                               basic_cstring<char_const>::null;
                                                  local_308 = &boost::unit_test::
                                                               basic_cstring<char_const>::null;
                                                  boost::unit_test::unit_test_log_t::set_checkpoint
                                                            (boost::unit_test::(anonymous_namespace)
                                                             ::unit_test_log,&local_300,0x17a);
                                                  local_8d0 = local_8d0 & 0xffffffffffffff00;
                                                  local_8d8 = (undefined4 ***)
                                                              &PTR__lazy_ostream_00236060;
                                                  sStack_8c8.pi_ =
                                                       (sp_counted_base *)
                                                       &boost::unit_test::lazy_ostream::inst;
                                                  local_8c0 = "";
                                                  local_94c = (int)mb.matrix_.matrix_._M_h.
                                                                   _M_element_count;
                                                  local_8f0._0_1_ =
                                                       (
                                                  _func_bool__Any_data_ptr__Any_data_ptr__Manager_operation
                                                  )((int)mb.matrix_.matrix_._M_h._M_element_count ==
                                                   0);
                                                  local_8f4 = 0;
                                                  local_8e8 = (char *)0x0;
                                                  sStack_8e0.pi_ = (sp_counted_base *)0x0;
                                                  local_8b8 = (undefined4 **)0x1f32e6;
                                                  local_8b0 = "";
                                                  local_948 = &local_94c;
                                                  local_930 = (char *)((ulong)local_930 &
                                                                      0xffffffffffffff00);
                                                  local_938 = (undefined4 ****)
                                                              &PTR__lazy_ostream_00235fd0;
                                                  sStack_928.pi_ =
                                                       (sp_counted_base *)
                                                       &boost::unit_test::lazy_ostream::inst;
                                                  local_920 = &local_948;
                                                  local_910 = (char *)((ulong)local_910 &
                                                                      0xffffffffffffff00);
                                                  local_918 = &PTR__lazy_ostream_00236020;
                                                  local_908 = &boost::unit_test::lazy_ostream::inst;
                                                  local_900 = &local_940;
                                                  local_940 = &local_8f4;
                                                  boost::test_tools::tt_detail::report_assertion();
                                                  boost::detail::shared_count::~shared_count
                                                            (&sStack_8e0);
                                                  Gudhi::persistence_matrix::swap
                                                            ((
                                                  Chain_matrix<Gudhi::persistence_matrix::Matrix<Chain_vine_options_with_row_access<(Gudhi::persistence_matrix::Column_types)7,_true,_false,_false,_false,_true,_false,_false>_>_>
                                                  *)(local_7a8 + 8),&mb.matrix_);
                                                  uVar13 = local_7a8._0_8_;
                                                  local_7a8._0_8_ = mb.colSettings_;
                                                  mb.colSettings_ = (Column_settings *)uVar13;
                                                  local_320 = 
                                                  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
                                                  ;
                                                  local_318 = "";
                                                  local_330 = &boost::unit_test::
                                                               basic_cstring<char_const>::null;
                                                  local_328 = &boost::unit_test::
                                                               basic_cstring<char_const>::null;
                                                  boost::unit_test::unit_test_log_t::set_checkpoint
                                                            (boost::unit_test::(anonymous_namespace)
                                                             ::unit_test_log,&local_320,0x17e);
                                                  local_8d0 = local_8d0 & 0xffffffffffffff00;
                                                  local_8d8 = (undefined4 ***)
                                                              &PTR__lazy_ostream_00236060;
                                                  sStack_8c8.pi_ =
                                                       (sp_counted_base *)
                                                       &boost::unit_test::lazy_ostream::inst;
                                                  local_8c0 = "";
                                                  local_94c = (int)local_728._M_element_count;
                                                  local_8f0._0_1_ =
                                                       (
                                                  _func_bool__Any_data_ptr__Any_data_ptr__Manager_operation
                                                  )((int)local_728._M_element_count == 0);
                                                  local_8f4 = 0;
                                                  local_8e8 = (char *)0x0;
                                                  sStack_8e0.pi_ = (sp_counted_base *)0x0;
                                                  local_8b8 = (undefined4 **)0x1f32e6;
                                                  local_8b0 = "";
                                                  local_948 = &local_94c;
                                                  local_930 = (char *)((ulong)local_930 &
                                                                      0xffffffffffffff00);
                                                  local_938 = (undefined4 ****)
                                                              &PTR__lazy_ostream_00235fd0;
                                                  sStack_928.pi_ =
                                                       (sp_counted_base *)
                                                       &boost::unit_test::lazy_ostream::inst;
                                                  local_920 = &local_948;
                                                  local_910 = (char *)((ulong)local_910 &
                                                                      0xffffffffffffff00);
                                                  local_918 = &PTR__lazy_ostream_00236020;
                                                  local_908 = &boost::unit_test::lazy_ostream::inst;
                                                  local_900 = &local_940;
                                                  local_940 = &local_8f4;
                                                  boost::test_tools::tt_detail::report_assertion();
                                                  boost::detail::shared_count::~shared_count
                                                            (&sStack_8e0);
                                                  local_340 = 
                                                  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
                                                  ;
                                                  local_338 = "";
                                                  local_350 = &boost::unit_test::
                                                               basic_cstring<char_const>::null;
                                                  local_348 = &boost::unit_test::
                                                               basic_cstring<char_const>::null;
                                                  boost::unit_test::unit_test_log_t::set_checkpoint
                                                            (boost::unit_test::(anonymous_namespace)
                                                             ::unit_test_log,&local_340,0x17f);
                                                  local_8d0 = local_8d0 & 0xffffffffffffff00;
                                                  local_8d8 = (undefined4 ***)
                                                              &PTR__lazy_ostream_00236060;
                                                  sStack_8c8.pi_ =
                                                       (sp_counted_base *)
                                                       &boost::unit_test::lazy_ostream::inst;
                                                  local_8c0 = "";
                                                  local_94c = (int)mb.matrix_.matrix_._M_h.
                                                                   _M_element_count;
                                                  local_8f0._0_1_ =
                                                       (
                                                  _func_bool__Any_data_ptr__Any_data_ptr__Manager_operation
                                                  )((int)mb.matrix_.matrix_._M_h._M_element_count ==
                                                   7);
                                                  local_8f4 = 7;
                                                  local_8e8 = (char *)0x0;
                                                  sStack_8e0.pi_ = (sp_counted_base *)0x0;
                                                  local_8b8 = (undefined4 **)0x1f32e6;
                                                  local_8b0 = "";
                                                  local_948 = &local_94c;
                                                  local_930 = (char *)((ulong)local_930 &
                                                                      0xffffffffffffff00);
                                                  local_938 = (undefined4 ****)
                                                              &PTR__lazy_ostream_00235fd0;
                                                  sStack_928.pi_ =
                                                       (sp_counted_base *)
                                                       &boost::unit_test::lazy_ostream::inst;
                                                  local_920 = &local_948;
                                                  local_910 = (char *)((ulong)local_910 &
                                                                      0xffffffffffffff00);
                                                  local_918 = &PTR__lazy_ostream_00236020;
                                                  local_908 = &boost::unit_test::lazy_ostream::inst;
                                                  local_900 = &local_940;
                                                  local_940 = &local_8f4;
                                                  boost::test_tools::tt_detail::report_assertion();
                                                  boost::detail::shared_count::~shared_count
                                                            (&sStack_8e0);
                                                  local_360 = 
                                                  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
                                                  ;
                                                  local_358 = "";
                                                  local_370 = &boost::unit_test::
                                                               basic_cstring<char_const>::null;
                                                  local_368 = &boost::unit_test::
                                                               basic_cstring<char_const>::null;
                                                  boost::unit_test::unit_test_log_t::set_checkpoint
                                                            (boost::unit_test::(anonymous_namespace)
                                                             ::unit_test_log,&local_360,0x180);
                                                  local_8d0 = local_8d0 & 0xffffffffffffff00;
                                                  local_8d8 = (undefined4 ***)
                                                              &PTR__lazy_ostream_00236060;
                                                  sStack_8c8.pi_ =
                                                       (sp_counted_base *)
                                                       &boost::unit_test::lazy_ostream::inst;
                                                  local_8c0 = "";
                                                  auVar11._8_8_ = 0;
                                                  auVar11._0_8_ =
                                                       mb.matrix_.matrix_._M_h._M_bucket_count;
                                                  uVar14 = SUB168((ZEXT816(0) << 0x40 | ZEXT816(2))
                                                                  % auVar11,0);
                                                  if (mb.matrix_.matrix_._M_h._M_buckets
                                                      [uVar14 & 0xffffffff] != (__node_base_ptr)0x0)
                                                  {
                                                    p_Var2 = mb.matrix_.matrix_._M_h._M_buckets
                                                             [uVar14 & 0xffffffff]->_M_nxt;
                                                    uVar1 = *(uint *)&p_Var2[1]._M_nxt;
                                                    do {
                                                      if (uVar1 == 2) {
                                                        local_94c = *(int *)&p_Var2[4]._M_nxt;
                                                        local_8f4 = 0;
                                                        local_8f0._0_1_ =
                                                             (
                                                  _func_bool__Any_data_ptr__Any_data_ptr__Manager_operation
                                                  )(local_94c == 0);
                                                  local_8e8 = (char *)0x0;
                                                  sStack_8e0.pi_ = (sp_counted_base *)0x0;
                                                  local_8b8 = (undefined4 **)0x1f32e6;
                                                  local_8b0 = "";
                                                  local_948 = &local_94c;
                                                  local_930 = (char *)((ulong)local_930 &
                                                                      0xffffffffffffff00);
                                                  local_938 = (undefined4 ****)
                                                              &PTR__lazy_ostream_00236020;
                                                  sStack_928.pi_ =
                                                       (sp_counted_base *)
                                                       &boost::unit_test::lazy_ostream::inst;
                                                  local_920 = &local_948;
                                                  local_910 = (char *)((ulong)local_910 &
                                                                      0xffffffffffffff00);
                                                  local_918 = &PTR__lazy_ostream_00236020;
                                                  local_908 = &boost::unit_test::lazy_ostream::inst;
                                                  local_900 = &local_940;
                                                  local_940 = &local_8f4;
                                                  boost::test_tools::tt_detail::report_assertion
                                                            (&local_8f0,&local_8d8,&local_8b8,0x180,
                                                             1,2,2,"mb.get_column_dimension(2)",
                                                             &local_938,"0",&local_918);
                                                  boost::detail::shared_count::~shared_count
                                                            (&sStack_8e0);
                                                  local_380 = 
                                                  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
                                                  ;
                                                  local_378 = "";
                                                  boost::unit_test::unit_test_log_t::set_checkpoint
                                                            (boost::unit_test::(anonymous_namespace)
                                                             ::unit_test_log,&local_380,0x181);
                                                  local_8d0 = local_8d0 & 0xffffffffffffff00;
                                                  local_8d8 = (undefined4 ***)
                                                              &PTR__lazy_ostream_00236060;
                                                  sStack_8c8.pi_ =
                                                       (sp_counted_base *)
                                                       &boost::unit_test::lazy_ostream::inst;
                                                  local_8c0 = "";
                                                  auVar12._8_8_ = 0;
                                                  auVar12._0_8_ =
                                                       mb.matrix_.matrix_._M_h._M_bucket_count;
                                                  uVar14 = SUB168((ZEXT816(0) << 0x40 | ZEXT816(6))
                                                                  % auVar12,0);
                                                  if (mb.matrix_.matrix_._M_h._M_buckets
                                                      [uVar14 & 0xffffffff] != (__node_base_ptr)0x0)
                                                  {
                                                    p_Var2 = mb.matrix_.matrix_._M_h._M_buckets
                                                             [uVar14 & 0xffffffff]->_M_nxt;
                                                    uVar1 = *(uint *)&p_Var2[1]._M_nxt;
                                                    do {
                                                      if (uVar1 == 6) {
                                                        local_94c = *(int *)&p_Var2[4]._M_nxt;
                                                        local_8f4 = 2;
                                                        local_8f0 = (char *)CONCAT71(local_8f0._1_7_
                                                                                     ,local_94c == 2
                                                                                    );
                                                        local_8e8 = (char *)0x0;
                                                        sStack_8e0.pi_ = (sp_counted_base *)0x0;
                                                        local_8b8 = (undefined4 **)0x1f32e6;
                                                        local_8b0 = "";
                                                        local_948 = &local_94c;
                                                        local_930 = (char *)((ulong)local_930 &
                                                                            0xffffffffffffff00);
                                                        local_938 = (undefined4 ****)
                                                                    &PTR__lazy_ostream_00236020;
                                                        sStack_928.pi_ =
                                                             (sp_counted_base *)
                                                             &boost::unit_test::lazy_ostream::inst;
                                                        local_920 = &local_948;
                                                        local_910 = (char *)((ulong)local_910 &
                                                                            0xffffffffffffff00);
                                                        local_918 = &PTR__lazy_ostream_00236020;
                                                        local_908 = &boost::unit_test::lazy_ostream
                                                                     ::inst;
                                                        local_900 = &local_940;
                                                        local_940 = &local_8f4;
                                                        boost::test_tools::tt_detail::
                                                        report_assertion(&local_8f0,&local_8d8,
                                                                         &local_8b8,0x181,1,2,2,
                                                                                                                                                  
                                                  "mb.get_column_dimension(6)",&local_938,"2",
                                                  &local_918);
                                                  boost::detail::shared_count::~shared_count
                                                            (&sStack_8e0);
                                                  Gudhi::persistence_matrix::
                                                  Matrix<Chain_vine_options_with_row_access<(Gudhi::persistence_matrix::Column_types)7,_true,_false,_false,_false,_true,_false,_false>_>
                                                  ::~Matrix((
                                                  Matrix<Chain_vine_options_with_row_access<(Gudhi::persistence_matrix::Column_types)7,_true,_false,_false,_false,_true,_false,_false>_>
                                                  *)local_7a8);
                                                  Gudhi::persistence_matrix::
                                                  Matrix<Chain_vine_options_with_row_access<(Gudhi::persistence_matrix::Column_types)7,_true,_false,_false,_false,_true,_false,_false>_>
                                                  ::~Matrix(&mc2);
                                                  Gudhi::persistence_matrix::
                                                  Matrix<Chain_vine_options_with_row_access<(Gudhi::persistence_matrix::Column_types)7,_true,_false,_false,_false,_true,_false,_false>_>
                                                  ::~Matrix(&mc1);
                                                  Gudhi::persistence_matrix::
                                                  Matrix<Chain_vine_options_with_row_access<(Gudhi::persistence_matrix::Column_types)7,_true,_false,_false,_false,_true,_false,_false>_>
                                                  ::~Matrix(&mr);
                                                  Gudhi::persistence_matrix::
                                                  Matrix<Chain_vine_options_with_row_access<(Gudhi::persistence_matrix::Column_types)7,_true,_false,_false,_false,_true,_false,_false>_>
                                                  ::~Matrix(&mb);
                                                  Gudhi::persistence_matrix::
                                                  Matrix<Chain_vine_options_with_row_access<(Gudhi::persistence_matrix::Column_types)7,_true,_false,_false,_false,_true,_false,_false>_>
                                                  ::~Matrix(&m);
                                                  std::
                                                  vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                                                  ::~vector(&ordered_boundaries);
                                                  return;
                                                  }
                                                  p_Var2 = p_Var2->_M_nxt;
                                                  } while ((p_Var2 != (_Hash_node_base *)0x0) &&
                                                          (uVar1 = *(uint *)&p_Var2[1]._M_nxt,
                                                          (ulong)uVar1 %
                                                          mb.matrix_.matrix_._M_h._M_bucket_count ==
                                                          uVar14));
                                                  }
                                                  std::__throw_out_of_range("_Map_base::at");
                                                  }
                                                  p_Var2 = p_Var2->_M_nxt;
                                                  } while ((p_Var2 != (_Hash_node_base *)0x0) &&
                                                          (uVar1 = *(uint *)&p_Var2[1]._M_nxt,
                                                          (ulong)uVar1 %
                                                          mb.matrix_.matrix_._M_h._M_bucket_count ==
                                                          uVar14));
                                                  }
                                                  std::__throw_out_of_range("_Map_base::at");
                                                }
                                                p_Var2 = p_Var2->_M_nxt;
                                              } while ((p_Var2 != (_Hash_node_base *)0x0) &&
                                                      (uVar1 = *(uint *)&p_Var2[1]._M_nxt,
                                                      (ulong)uVar1 % local_728._M_bucket_count ==
                                                      uVar14));
                                            }
                                            std::__throw_out_of_range("_Map_base::at");
                                          }
                                          p_Var2 = p_Var2->_M_nxt;
                                        } while ((p_Var2 != (_Hash_node_base *)0x0) &&
                                                (uVar1 = *(uint *)&p_Var2[1]._M_nxt,
                                                (ulong)uVar1 % local_728._M_bucket_count == uVar14))
                                        ;
                                      }
                                      std::__throw_out_of_range("_Map_base::at");
                                    }
                                    p_Var2 = p_Var2->_M_nxt;
                                  } while ((p_Var2 != (_Hash_node_base *)0x0) &&
                                          (uVar1 = *(uint *)&p_Var2[1]._M_nxt,
                                          (ulong)uVar1 % mc2.matrix_.matrix_._M_h._M_bucket_count ==
                                          uVar14));
                                }
                                std::__throw_out_of_range("_Map_base::at");
                              }
                              p_Var2 = p_Var2->_M_nxt;
                            } while ((p_Var2 != (_Hash_node_base *)0x0) &&
                                    (uVar1 = *(uint *)&p_Var2[1]._M_nxt,
                                    (ulong)uVar1 % mc2.matrix_.matrix_._M_h._M_bucket_count ==
                                    uVar14));
                          }
                          std::__throw_out_of_range("_Map_base::at");
                        }
                        p_Var2 = p_Var2->_M_nxt;
                      } while ((p_Var2 != (_Hash_node_base *)0x0) &&
                              (uVar1 = *(uint *)&p_Var2[1]._M_nxt,
                              (ulong)uVar1 % mc1.matrix_.matrix_._M_h._M_bucket_count == uVar14));
                    }
                    std::__throw_out_of_range("_Map_base::at");
                  }
                  p_Var2 = p_Var2->_M_nxt;
                } while ((p_Var2 != (_Hash_node_base *)0x0) &&
                        (uVar1 = *(uint *)&p_Var2[1]._M_nxt,
                        (ulong)uVar1 % mc1.matrix_.matrix_._M_h._M_bucket_count == uVar14));
              }
              std::__throw_out_of_range("_Map_base::at");
            }
            p_Var2 = p_Var2->_M_nxt;
          } while ((p_Var2 != (_Hash_node_base *)0x0) &&
                  (uVar1 = *(uint *)&p_Var2[1]._M_nxt,
                  (ulong)uVar1 % mb.matrix_.matrix_._M_h._M_bucket_count == uVar14));
        }
        std::__throw_out_of_range("_Map_base::at");
      }
      p_Var2 = p_Var2->_M_nxt;
    } while ((p_Var2 != (_Hash_node_base *)0x0) &&
            (uVar1 = *(uint *)&p_Var2[1]._M_nxt,
            (ulong)uVar1 % mb.matrix_.matrix_._M_h._M_bucket_count == uVar14));
  }
  std::__throw_out_of_range("_Map_base::at");
}

Assistant:

void test_chain_constructors() {
  auto ordered_boundaries = build_simple_boundary_matrix<typename Matrix::Column>();

  // default constructor
  Matrix m(birth_comp, death_comp);
  BOOST_CHECK_EQUAL(m.get_number_of_columns(), 0);

  // constructor from given @ref boundarymatrix "boundary matrix"
  Matrix mb(ordered_boundaries, birth_comp, death_comp, 5);
  BOOST_CHECK_EQUAL(mb.get_number_of_columns(), 7);
  BOOST_CHECK_EQUAL(mb.get_column_dimension(2), 0);
  BOOST_CHECK_EQUAL(mb.get_column_dimension(6), 2);

  // constructor reserving column space
  Matrix mr(5, birth_comp, death_comp);
  BOOST_CHECK_EQUAL(mr.get_number_of_columns(), 0);

  // copy constructor
  Matrix mc1(mb);
  Matrix mc2 = mb;
  BOOST_CHECK_EQUAL(mc1.get_number_of_columns(), 7);
  BOOST_CHECK_EQUAL(mc1.get_column_dimension(2), 0);
  BOOST_CHECK_EQUAL(mc1.get_column_dimension(6), 2);
  BOOST_CHECK_EQUAL(mc2.get_number_of_columns(), 7);
  BOOST_CHECK_EQUAL(mc2.get_column_dimension(2), 0);
  BOOST_CHECK_EQUAL(mc2.get_column_dimension(6), 2);

  // move constructor
  Matrix mm(std::move(mb));
  BOOST_CHECK_EQUAL(mm.get_number_of_columns(), 7);
  BOOST_CHECK_EQUAL(mm.get_column_dimension(2), 0);
  BOOST_CHECK_EQUAL(mm.get_column_dimension(6), 2);
  BOOST_CHECK_EQUAL(mb.get_number_of_columns(), 0);

  // swap
  swap(mm, mb);
  BOOST_CHECK_EQUAL(mm.get_number_of_columns(), 0);
  BOOST_CHECK_EQUAL(mb.get_number_of_columns(), 7);
  BOOST_CHECK_EQUAL(mb.get_column_dimension(2), 0);
  BOOST_CHECK_EQUAL(mb.get_column_dimension(6), 2);
}